

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O1

qpdflogger_handle qpdfjob_get_logger(qpdfjob_handle j)

{
  _qpdflogger_handle *this;
  shared_ptr<QPDFLogger> local_20;
  
  this = (_qpdflogger_handle *)operator_new(0x10);
  QPDFJob::getLogger(&j->j);
  _qpdflogger_handle::_qpdflogger_handle(this,&local_20);
  if (local_20.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  return this;
}

Assistant:

qpdflogger_handle
qpdfjob_get_logger(qpdfjob_handle j)
{
    return new _qpdflogger_handle(j->j.getLogger());
}